

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::TrackInlineeArgLifetimes(LinearScan *this,Instr *instr)

{
  uint32 uVar1;
  Lifetime *pLVar2;
  Type pSVar3;
  Type pSVar4;
  ArgList *pAVar5;
  Type pIVar6;
  StackSym *pSVar7;
  anon_union_8_3_6c1fdb8e_for_scratch aVar8;
  code *pcVar9;
  bool bVar10;
  int iVar11;
  InlineeFrameInfoValueType IVar12;
  undefined4 *puVar13;
  Func **ppFVar14;
  JITTimeFunctionBody *this_00;
  intptr_t functionBodyAddr;
  Func *pFVar15;
  Func *pFVar16;
  char *message;
  char *error;
  long lVar17;
  LoweredBasicBlock *pLVar18;
  uint lineNumber;
  char *fileName;
  InlineeFrameInfo *pIVar19;
  uint *key;
  uint uVar20;
  long lVar21;
  long lVar22;
  SymID *key_00;
  uint *local_50;
  uint *value;
  Lifetime *local_40;
  uint local_34 [2];
  int i;
  
  if (instr->m_opcode != InlineeEnd) {
    if (instr->m_opcode == InlineeStart) {
      pFVar16 = instr->m_func;
      if ((pFVar16->field_0x240 & 2) == 0) {
        if ((pFVar16->parentFunc->field_0x240 & 2) == 0) {
          return;
        }
        if (pFVar16->frameInfo != (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0xd95,"(!instr->m_func->frameInfo)","!instr->m_func->frameInfo");
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
          pFVar16 = instr->m_func;
        }
        if (pFVar16->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0xd96,"(instr->m_func->cachedInlineeFrameInfo)",
                              "instr->m_func->cachedInlineeFrameInfo");
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
        }
        if (((this->currentBlock->inlineeStack).
             super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) &&
           (uVar1 = instr->m_func->inlineDepth,
           ppFVar14 = JsUtil::
                      List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Last(&this->currentBlock->inlineeStack),
           uVar1 != (*ppFVar14)->inlineDepth + 1)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0xd98,
                              "(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1)"
                              ,
                              "this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1"
                             );
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
        }
        pLVar18 = this->currentBlock;
        JsUtil::
        List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(&pLVar18->inlineeStack,0);
        pFVar16 = instr->m_func;
      }
      else {
        pIVar19 = pFVar16->frameInfo;
        pAVar5 = pIVar19->arguments;
        if (0 < (pAVar5->
                super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count) {
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          lVar17 = 0;
          lVar22 = 0;
          do {
            pIVar6 = (pAVar5->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            iVar11 = *(int *)((long)&pIVar6->type + lVar17);
            if (iVar11 == 1) {
              lVar21 = *(long *)((long)&pIVar6->field_1 + lVar17);
              local_40 = *(Lifetime **)(lVar21 + 0x48);
              pLVar18 = this->currentBlock;
              value = &pIVar6->type;
              JsUtil::
              List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray(&pLVar18->inlineeFrameLifetimes,0);
              iVar11 = (pLVar18->inlineeFrameLifetimes).
                       super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                       count;
              (pLVar18->inlineeFrameLifetimes).
              super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer
              [iVar11] = local_40;
              (pLVar18->inlineeFrameLifetimes).
              super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count =
                   iVar11 + 1;
              key = (uint *)(lVar21 + 0x10);
              bVar10 = JsUtil::
                       BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ::TryGetReference<unsigned_int>
                                 (&this->currentBlock->inlineeFrameSyms,key,&local_50,
                                  (int *)local_34);
              if (bVar10) {
                *local_50 = *local_50 + 1;
              }
              else {
                local_34[0] = 1;
                JsUtil::
                BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                          ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)&this->currentBlock->inlineeFrameSyms,key,local_34);
              }
              iVar11 = *(int *)((long)value + lVar17);
            }
            if (iVar11 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                                  ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                                  "value.type != InlineeFrameInfoValueType_None");
              if (!bVar10) goto LAB_005879a9;
              *puVar13 = 0;
            }
            lVar22 = lVar22 + 1;
            lVar17 = lVar17 + 0x18;
          } while (lVar22 < (pAVar5->
                            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                            ).count);
        }
        IVar12 = (pIVar19->function).type;
        if (IVar12 == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                              ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                              "function.type != InlineeFrameInfoValueType_None");
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
          IVar12 = (pIVar19->function).type;
        }
        if (IVar12 == InlineeFrameInfoValueType_Sym) {
          pSVar7 = (pIVar19->function).field_1.sym;
          aVar8 = pSVar7->scratch;
          pLVar18 = this->currentBlock;
          JsUtil::
          List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(&pLVar18->inlineeFrameLifetimes,0);
          iVar11 = (pLVar18->inlineeFrameLifetimes).
                   super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count;
          *(anon_union_8_3_6c1fdb8e_for_scratch *)
           ((pLVar18->inlineeFrameLifetimes).
            super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer +
           iVar11) = aVar8;
          (pLVar18->inlineeFrameLifetimes).
          super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count =
               iVar11 + 1;
          key_00 = &(pSVar7->super_Sym).m_id;
          bVar10 = JsUtil::
                   BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::TryGetReference<unsigned_int>
                             (&this->currentBlock->inlineeFrameSyms,key_00,&local_50,(int *)local_34
                             );
          if (bVar10) {
            *local_50 = *local_50 + 1;
          }
          else {
            local_34[0] = 1;
            JsUtil::
            BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->currentBlock->inlineeFrameSyms,key_00,local_34);
          }
        }
        if ((0 < (this->currentBlock->inlineeStack).
                 super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count) &&
           (uVar20 = instr->m_func->inlineDepth,
           ppFVar14 = JsUtil::
                      List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Last(&this->currentBlock->inlineeStack), uVar20 <= (*ppFVar14)->inlineDepth)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0xd8f,
                              "(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth)"
                              ,
                              "instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth"
                             );
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
        }
        pLVar18 = this->currentBlock;
        JsUtil::
        List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(&pLVar18->inlineeStack,0);
        pFVar16 = instr->m_func;
      }
      iVar11 = (pLVar18->inlineeStack).
               super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count;
      (pLVar18->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
      .buffer[iVar11] = pFVar16;
      (pLVar18->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
      .count = iVar11 + 1;
      return;
    }
    bVar10 = IR::Instr::HasBailOnNoProfile(instr);
    if (!bVar10) {
      return;
    }
  }
  pFVar16 = instr->m_func;
  if ((pFVar16->field_0x240 & 2) == 0) {
    if (pFVar16->parentFunc == (Func *)0x0) {
      return;
    }
    if ((pFVar16->parentFunc->field_0x240 & 2) == 0) {
      return;
    }
    pIVar19 = pFVar16->cachedInlineeFrameInfo;
    if (pIVar19 == (InlineeFrameInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xda3,"(instr->m_func->cachedInlineeFrameInfo)",
                          "instr->m_func->cachedInlineeFrameInfo");
      if (!bVar10) goto LAB_005879a9;
      *puVar13 = 0;
      pFVar16 = instr->m_func;
      pIVar19 = pFVar16->cachedInlineeFrameInfo;
    }
    pFVar16->frameInfo = pIVar19;
  }
  else {
    pIVar19 = pFVar16->frameInfo;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(pFVar16->m_workItem);
  functionBodyAddr = JITTimeFunctionBody::GetAddr(this_00);
  InlineeFrameInfo::AllocateRecord(pIVar19,pFVar16,functionBodyAddr);
  pLVar18 = this->currentBlock;
  if ((pLVar18->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
      .count == 0) {
    if ((pLVar18->inlineeFrameLifetimes).
        super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xdab,"(this->currentBlock->inlineeFrameLifetimes.Count() == 0)",
                          "this->currentBlock->inlineeFrameLifetimes.Count() == 0");
      if (!bVar10) goto LAB_005879a9;
      *puVar13 = 0;
      pLVar18 = this->currentBlock;
    }
    if ((pLVar18->inlineeFrameSyms).count == (pLVar18->inlineeFrameSyms).freeCount) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
    ;
    error = "(this->currentBlock->inlineeFrameSyms.Count() == 0)";
    message = "this->currentBlock->inlineeFrameSyms.Count() == 0";
    lineNumber = 0xdac;
  }
  else {
    pFVar15 = JsUtil::
              List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::RemoveAtEnd(&pLVar18->inlineeStack);
    pFVar16 = instr->m_func;
    if (pFVar15 != pFVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xdb1,"(func == instr->m_func)","func == instr->m_func");
      if (!bVar10) goto LAB_005879a9;
      *puVar13 = 0;
      pFVar16 = instr->m_func;
    }
    if ((pFVar16->field_0x240 & 2) == 0) {
      return;
    }
    pLVar2 = (Lifetime *)pFVar16->frameInfo;
    if (*(int *)&pLVar2->sym == 1) {
      InlineeFrameInfo::
      IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
      ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                ((anon_class_8_1_8991fb9c_for_callback *)this,(StackSym *)pLVar2->regionUseCount);
    }
    pSVar3 = (pLVar2->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    uVar20 = *(int *)&pSVar3[2].next - 1;
    value = (uint *)this;
    local_40 = pLVar2;
    if (-1 < (int)uVar20) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar17 = (ulong)uVar20 * 0x18;
      lVar22 = (ulong)uVar20 + 1;
      do {
        pSVar4 = pSVar3[1].next;
        iVar11 = *(int *)((long)&pSVar4->next + lVar17);
        if (iVar11 == 1) {
          InlineeFrameInfo::
          IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
          ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                    ((anon_class_8_1_8991fb9c_for_callback *)value,
                     *(StackSym **)((long)&pSVar4[1].next + lVar17));
          iVar11 = *(int *)((long)&pSVar4->next + lVar17);
        }
        if (iVar11 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                              ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                              "value.type != InlineeFrameInfoValueType_None");
          if (!bVar10) goto LAB_005879a9;
          *puVar13 = 0;
        }
        lVar17 = lVar17 + -0x18;
        lVar21 = lVar22 + -1;
        bVar10 = 0 < lVar22;
        lVar22 = lVar21;
      } while (lVar21 != 0 && bVar10);
    }
    if (*(int *)&local_40->sym != 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
    ;
    error = "(function.type != InlineeFrameInfoValueType_None)";
    message = "function.type != InlineeFrameInfoValueType_None";
    lineNumber = 0xbf;
  }
  bVar10 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar10) {
    *puVar13 = 0;
    return;
  }
LAB_005879a9:
  pcVar9 = (code *)invalidInstructionException();
  (*pcVar9)();
}

Assistant:

void LinearScan::TrackInlineeArgLifetimes(IR::Instr* instr)
{
    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (instr->m_func->m_hasInlineArgsOpt)
        {
            instr->m_func->frameInfo->IterateSyms([=](StackSym* sym){
                Lifetime* lifetime = sym->scratch.linearScan.lifetime;
                this->currentBlock->inlineeFrameLifetimes.Add(lifetime);

                // We need to maintain as count because the same sym can be used for multiple arguments
                uint* value;
                if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                {
                    *value = *value + 1;
                }
                else
                {
                    this->currentBlock->inlineeFrameSyms.Add(sym->m_id, 1);
                }
            });
            if (this->currentBlock->inlineeStack.Count() > 0)
            {
                Assert(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth);
            }
            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
        else if (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
        {
            Assert(!instr->m_func->frameInfo);
            Assert(instr->m_func->cachedInlineeFrameInfo);
            
            Assert(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1);

            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineeEnd || instr->HasBailOnNoProfile())
    {
        if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc() && instr->m_func->GetParentFunc()->m_hasInlineArgsOpt))
        {
            if (!instr->m_func->m_hasInlineArgsOpt)
            {
                Assert(instr->m_func->cachedInlineeFrameInfo);
                instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
            }
            instr->m_func->frameInfo->AllocateRecord(instr->m_func, instr->m_func->GetJITFunctionBody()->GetAddr());

            if(this->currentBlock->inlineeStack.Count() == 0)
            {
                // Block is unreachable
                Assert(this->currentBlock->inlineeFrameLifetimes.Count() == 0);
                Assert(this->currentBlock->inlineeFrameSyms.Count() == 0);
            }
            else
            {
                Func* func = this->currentBlock->inlineeStack.RemoveAtEnd();
                Assert(func == instr->m_func);

                if (instr->m_func->m_hasInlineArgsOpt)
                {
                    instr->m_func->frameInfo->IterateSyms([=](StackSym* sym) {
                        Lifetime* lifetime = this->currentBlock->inlineeFrameLifetimes.RemoveAtEnd();

                        uint* value;
                        if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                        {
                            *value = *value - 1;
                            if (*value == 0)
                            {
                                bool removed = this->currentBlock->inlineeFrameSyms.Remove(sym->m_id);
                                Assert(removed);
                            }
                        }
                        else
                        {
                            Assert(UNREACHED);
                        }
                        Assert(sym->scratch.linearScan.lifetime == lifetime);
                        }, /*reverse*/ true);
                }
            }
        }
    }
}